

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void upb_inttable_removeiter(upb_inttable *t,intptr_t *iter)

{
  ulong uVar1;
  upb_tabent *puVar2;
  upb_tabval *puVar3;
  upb_tabent *puVar4;
  size_t sVar5;
  upb_tabent *local_40;
  upb_tabent *e;
  upb_tabent *end;
  upb_tabent *prev;
  upb_tabent *ent;
  intptr_t i;
  intptr_t *iter_local;
  upb_inttable *t_local;
  
  uVar1 = *iter;
  if (uVar1 < t->array_size) {
    t->array_count = t->array_count - 1;
    puVar3 = mutable_array(t);
    puVar3[uVar1].val = 0xffffffffffffffff;
  }
  else {
    puVar4 = (t->t).entries + (uVar1 - t->array_size);
    end = (upb_tabent *)0x0;
    puVar2 = (t->t).entries;
    sVar5 = upb_table_size(&t->t);
    for (local_40 = (t->t).entries; local_40 != puVar2 + sVar5; local_40 = local_40 + 1) {
      if (local_40->next == puVar4) {
        end = local_40;
        break;
      }
    }
    if (end != (upb_tabent *)0x0) {
      end->next = puVar4->next;
    }
    (t->t).count = (t->t).count - 1;
    puVar4->key = 0;
    puVar4->next = (_upb_tabent *)0x0;
  }
  return;
}

Assistant:

void upb_inttable_removeiter(upb_inttable* t, intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)i < t->array_size) {
    t->array_count--;
    mutable_array(t)[i].val = -1;
  } else {
    upb_tabent* ent = &t->t.entries[i - t->array_size];
    upb_tabent* prev = NULL;

    // Linear search, not great.
    upb_tabent* end = &t->t.entries[upb_table_size(&t->t)];
    for (upb_tabent* e = t->t.entries; e != end; e++) {
      if (e->next == ent) {
        prev = e;
        break;
      }
    }

    if (prev) {
      prev->next = ent->next;
    }

    t->t.count--;
    ent->key = 0;
    ent->next = NULL;
  }
}